

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.h
# Opt level: O0

void __thiscall wallet::COutput::ApplyBumpFee(COutput *this,CAmount bump_fee)

{
  long lVar1;
  bool bVar2;
  long *plVar3;
  long *in_RSI;
  undefined4 *in_RDI;
  long in_FS_OFFSET;
  optional<long> *in_stack_ffffffffffffffa8;
  optional<long> *this_00;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((long)in_RSI < 0) {
    __assert_fail("bump_fee >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                  ,0x72,"void wallet::COutput::ApplyBumpFee(CAmount)");
  }
  *(long **)(in_RDI + 0x26) = in_RSI;
  bVar2 = std::optional::operator_cast_to_bool(in_stack_ffffffffffffffa8);
  if (!bVar2) {
    __assert_fail("fee",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/coinselection.h"
                  ,0x74,"void wallet::COutput::ApplyBumpFee(CAmount)");
  }
  this_00 = (optional<long> *)(in_RDI + 4);
  plVar3 = std::optional<long>::operator*(in_stack_ffffffffffffffa8);
  *plVar3 = *plVar3 + (long)in_RSI;
  std::optional<long>::value(this_00);
  std::optional<long>::optional<long,_true>(this_00,in_RSI);
  *in_RDI = local_18;
  in_RDI[1] = uStack_14;
  in_RDI[2] = uStack_10;
  in_RDI[3] = uStack_c;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ApplyBumpFee(CAmount bump_fee)
    {
        assert(bump_fee >= 0);
        ancestor_bump_fees = bump_fee;
        assert(fee);
        *fee += bump_fee;
        // Note: assert(effective_value - bump_fee == nValue - fee.value());
        effective_value = txout.nValue - fee.value();
    }